

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SkelRoot>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,SkelRoot *root,
               string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  Attribute *this;
  AttrMeta *pAVar3;
  AttrMeta *pAVar4;
  Property *pPVar5;
  size_type sVar6;
  mapped_type *this_00;
  ostream *poVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  bool local_b29;
  bool local_b01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8 [32];
  string local_ab8 [32];
  ostringstream local_a98 [8];
  ostringstream ss_w_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0 [39];
  allocator local_8c9;
  string local_8c8 [32];
  fmt local_8a8 [32];
  ostringstream local_888 [8];
  ostringstream ss_e;
  allocator local_709;
  string local_708;
  string local_6e8;
  undefined1 local_6c8 [8];
  ParseResult ret;
  allocator local_689;
  value_type local_688 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_668;
  allocator local_641;
  string local_640;
  undefined1 local_620 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_2;
  allocator local_5e1;
  value_type local_5e0 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0 [32];
  ostringstream local_580 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string local_3e8;
  allocator local_3c1;
  key_type local_3c0 [4];
  _Base_ptr local_3a0;
  undefined1 local_398;
  allocator local_389;
  value_type local_388 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_368;
  allocator local_341;
  string local_340;
  undefined1 local_320 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr_1;
  allocator local_2e1;
  value_type local_2e0 [4];
  Attribute *local_2c0;
  Attribute *attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  ostringstream local_278 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  allocator local_b9;
  key_type local_b8 [4];
  reference local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  SkelRoot *root_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  bVar1 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)root,
                     (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin(properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end(properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      local_98 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                 ::operator*(&__end2);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,"visibility");
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_b8,"visibility",&local_b9);
        sVar6 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_70,local_b8);
        ::std::__cxx11::string::~string((string *)local_b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        if (sVar6 == 0) {
          Property::value_type_name_abi_cxx11_(&local_e0,&local_98->second);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          _Var2 = ::std::operator==(&local_e0,&local_100);
          local_b01 = false;
          if (_Var2) {
            bVar1 = Property::is_attribute(&local_98->second);
            local_b01 = false;
            if (bVar1) {
              local_b01 = Property::is_empty(&local_98->second);
            }
          }
          ::std::__cxx11::string::~string((string *)&local_100);
          ::std::__cxx11::string::~string((string *)&local_e0);
          if (local_b01 == false) {
            fun._M_invoker = (_Invoker_type)Property::get_attribute(&local_98->second);
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
            ::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                      ((function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
                        *)local_320,VisibilityEnumHandler);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_340,"visibility",&local_341);
            bVar1 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function(&local_368,
                       (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_320);
            bVar1 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                              (&local_340,(bool)(bVar1 & 1),&local_368,(Attribute *)fun._M_invoker,
                               &root->visibility,warn,
                               (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::~function(&local_368);
            ::std::__cxx11::string::~string((string *)&local_340);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_341);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              pAVar3 = Attribute::metas((Attribute *)fun._M_invoker);
              pAVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::
                       metas(&root->visibility);
              AttrMetas::operator=(pAVar4,pAVar3);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_388,"visibility",&local_389);
              pVar8 = ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_70,local_388);
              local_3a0 = (_Base_ptr)pVar8.first._M_node;
              local_398 = pVar8.second;
              ::std::__cxx11::string::~string((string *)local_388);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
              __range2._4_4_ = 3;
            }
            else {
              spec_local._7_1_ = 0;
              __range2._4_4_ = 1;
            }
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::~function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)local_320);
            goto joined_r0x002a5c65;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_278);
          poVar7 = ::std::operator<<((ostream *)local_278,"[warn]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb37);
          ::std::operator<<(poVar7," ");
          poVar7 = ::std::operator<<((ostream *)local_278,"No value assigned to `");
          poVar7 = ::std::operator<<(poVar7,"visibility");
          poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
          ::std::operator<<(poVar7,"\n");
          if (warn != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_298,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &attr);
            ::std::__cxx11::string::operator=((string *)warn,(string *)local_298);
            ::std::__cxx11::string::~string((string *)local_298);
            ::std::__cxx11::string::~string((string *)&attr);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_278);
          local_2c0 = Property::get_attribute(&local_98->second);
          pAVar3 = Attribute::metas(local_2c0);
          pAVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::metas
                             (&root->visibility);
          AttrMetas::operator=(pAVar4,pAVar3);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_2e0,"visibility",&local_2e1);
          ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,local_2e0);
          ::std::__cxx11::string::~string((string *)local_2e0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        }
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_98,"purpose");
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_3c0,"purpose",&local_3c1);
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,local_3c0);
          ::std::__cxx11::string::~string((string *)local_3c0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
          if (sVar6 == 0) {
            Property::value_type_name_abi_cxx11_(&local_3e8,&local_98->second);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var2 = ::std::operator==(&local_3e8,&local_408);
            local_b29 = false;
            if (_Var2) {
              bVar1 = Property::is_attribute(&local_98->second);
              local_b29 = false;
              if (bVar1) {
                local_b29 = Property::is_empty(&local_98->second);
              }
            }
            ::std::__cxx11::string::~string((string *)&local_408);
            ::std::__cxx11::string::~string((string *)&local_3e8);
            if (local_b29 == false) {
              fun_1._M_invoker = (_Invoker_type)Property::get_attribute(&local_98->second);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
              ::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                        ((function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                          *)local_620,PurposeEnumHandler);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_640,"purpose",&local_641);
              bVar1 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_668,
                         (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_620);
              bVar1 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                (&local_640,(bool)(bVar1 & 1),&local_668,
                                 (Attribute *)fun_1._M_invoker,&root->purpose,warn,
                                 (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function(&local_668);
              ::std::__cxx11::string::~string((string *)&local_640);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_641);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                pAVar3 = Attribute::metas((Attribute *)fun_1._M_invoker);
                pAVar4 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas(&root->purpose);
                AttrMetas::operator=(pAVar4,pAVar3);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)local_688,"purpose",&local_689);
                pVar8 = ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_70,local_688);
                ret.err.field_2._8_8_ = pVar8.first._M_node;
                ::std::__cxx11::string::~string((string *)local_688);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_689);
                __range2._4_4_ = 3;
              }
              else {
                spec_local._7_1_ = 0;
                __range2._4_4_ = 1;
              }
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)local_620);
              goto joined_r0x002a5c65;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_580);
            poVar7 = ::std::operator<<((ostream *)local_580,"[warn]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb39);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_580,"No value assigned to `");
            poVar7 = ::std::operator<<(poVar7,"purpose");
            poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
            ::std::operator<<(poVar7,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_5a0,local_5c0);
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_5a0);
              ::std::__cxx11::string::~string((string *)local_5a0);
              ::std::__cxx11::string::~string((string *)local_5c0);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_580);
            this = Property::get_attribute(&local_98->second);
            pAVar3 = Attribute::metas(this);
            pAVar4 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas(&root->purpose);
            AttrMetas::operator=(pAVar4,pAVar3);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_5e0,"purpose",&local_5e1);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,local_5e0);
            ::std::__cxx11::string::~string((string *)local_5e0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
          }
        }
        else {
          ::std::__cxx11::string::string((string *)&local_6e8,(string *)local_98);
          pPVar5 = &local_98->second;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_708,"extent",&local_709);
          anon_unknown_0::ParseExtentAttribute
                    ((ParseResult *)local_6c8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,&local_6e8,pPVar5,&local_708,&root->extent);
          ::std::__cxx11::string::~string((string *)&local_708);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_709);
          ::std::__cxx11::string::~string((string *)&local_6e8);
          if ((local_6c8._0_4_ == Success) || (local_6c8._0_4_ == AlreadyProcessed)) {
            __range2._4_4_ = 3;
          }
          else if (local_6c8._0_4_ == Unmatched) {
            __range2._4_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_888);
            poVar7 = ::std::operator<<((ostream *)local_888,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb3a);
            ::std::operator<<(poVar7," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_8c8,"Parsing attribute `extent` failed. Error: {}",&local_8c9);
            fmt::format<std::__cxx11::string>
                      (local_8a8,(string *)local_8c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
            poVar7 = ::std::operator<<((ostream *)local_888,(string *)local_8a8);
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::string::~string((string *)local_8a8);
            ::std::__cxx11::string::~string(local_8c8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
            if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_8f0,local_910);
              ::std::__cxx11::string::operator=
                        ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (string *)local_8f0);
              ::std::__cxx11::string::~string((string *)local_8f0);
              ::std::__cxx11::string::~string((string *)local_910);
            }
            spec_local._7_1_ = 0;
            __range2._4_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_888);
          }
          anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_6c8);
          if (__range2._4_4_ == 0) {
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,&local_98->first);
            if (sVar6 == 0) {
              pPVar5 = &local_98->second;
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](&root->props,&local_98->first);
              Property::operator=(this_00,pPVar5);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,&local_98->first);
            }
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,&local_98->first);
            if (sVar6 == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_a98);
              poVar7 = ::std::operator<<((ostream *)local_a98,"[warn]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb3c);
              ::std::operator<<(poVar7," ");
              ::std::operator+((char *)local_ab8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Unsupported/unimplemented property: ");
              poVar7 = ::std::operator<<((ostream *)local_a98,local_ab8);
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::string::~string(local_ab8);
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_ad8,local_af8);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_ad8);
                ::std::__cxx11::string::~string((string *)local_ad8);
                ::std::__cxx11::string::~string((string *)local_af8);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_a98);
            }
          }
          else {
joined_r0x002a5c65:
            if (__range2._4_4_ != 3) goto LAB_002a654c;
          }
        }
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002a654c:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<SkelRoot>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SkelRoot *root,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &root->xformOps, err)) {
    return false;
  }

  // SkelRoot is something like a grouping node, having 1 Skeleton and possibly?
  // multiple Prim hierarchy containing GeomMesh.
  // No specific properties for SkelRoot(AFAIK)

  // custom props only
  for (const auto &prop : properties) {
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, SkelRoot,
                   root->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, SkelRoot,
                       root->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, SkelRoot, root->extent)
    ADD_PROPERTY(table, prop, SkelRoot, root->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}